

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
::HashElement::operator()(HashElement *this,char (*key) [10])

{
  Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  undefined1 auVar1 [16];
  size_t sVar2;
  allocator local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this_00 = *(Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              **)this;
  std::__cxx11::string::string((string *)&local_30,*key,&local_31);
  sVar2 = Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          _hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (this_00,&local_30);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar2;
  std::__cxx11::string::~string((string *)&local_30);
  return SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0) +
         SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8);
}

Assistant:

size_t operator()(const K& key, Args&&...) const
				{
					return phmap_mix<sizeof(size_t)>()(h(key));
				}